

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# behaviour_dictionary.c
# Opt level: O2

void test_bhdct_get_populated_single_string_key(planck_unit_test_t *tc)

{
  undefined4 local_a8;
  undefined4 local_a4;
  char key [9];
  ion_dictionary_t dict;
  ion_dictionary_handler_t handler;
  
  key[8] = '\0';
  key[0] = '\0';
  key[1] = '\0';
  key[2] = '\0';
  key[3] = '\0';
  key[4] = '\0';
  key[5] = '\0';
  key[6] = '\0';
  key[7] = '\0';
  bhdct_setup_string_key(tc,&handler,&dict,ion_fill_low);
  sprintf(key,"k%d",0x5c);
  local_a4 = 0x5c;
  bhdct_insert(tc,&dict,key,&local_a4,'\x01');
  local_a8 = 0x5c;
  bhdct_get(tc,&dict,key,&local_a8,'\0',1);
  bhdct_takedown(tc,&dict);
  return;
}

Assistant:

void
test_bhdct_get_populated_single_string_key(
	planck_unit_test_t *tc
) {
	ion_dictionary_handler_t	handler;
	ion_dictionary_t			dict;
	char						key[ION_BHDCT_STRING_KEY_BUFFER_SIZE] = { 0 };

	bhdct_setup_string_key(tc, &handler, &dict, ion_fill_low);

	sprintf(key, ION_BHDCT_STRING_KEY_PAYLOAD, 92);
	bhdct_insert(tc, &dict, key, IONIZE(92, int), boolean_true);
	bhdct_get(tc, &dict, key, IONIZE(92, int), err_ok, 1);

	bhdct_takedown(tc, &dict);
}